

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O2

bool __thiscall
ElfRelocator::relocateFile(ElfRelocator *this,ElfRelocatorFile *file,int64_t *relocationAddress)

{
  uint uVar1;
  Elf32_Word EVar2;
  ElfFile *this_00;
  long lVar3;
  pointer pEVar4;
  ElfSection *pEVar5;
  element_type *peVar6;
  size_t sVar7;
  pointer pbVar8;
  IElfRelocator *pIVar9;
  long lVar10;
  pointer pEVar11;
  bool bVar12;
  pointer pRVar13;
  byte bVar14;
  int iVar15;
  ulong *puVar16;
  mapped_type *pmVar17;
  string *args_1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar18;
  ElfRelocatorSection *entry;
  pointer pEVar19;
  size_t pos;
  ElfRelocator *this_01;
  ElfRelocatorSymbol *sym_1;
  pointer pEVar20;
  mapped_type mVar21;
  pointer pbVar22;
  uint uVar23;
  string *error;
  pointer pbVar24;
  int64_t iVar25;
  uint offset;
  RelocationAction *action;
  pointer pRVar26;
  string_view text;
  string_view text_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  long local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  int symNum;
  ElfRelocatorFile *local_140;
  Elf32_Sym sym;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  Elf32_Rela rela;
  shared_ptr<Label> label;
  ByteArray sectionData;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> relocationOffsets;
  string local_70;
  string local_50;
  
  this_00 = file->elf;
  lVar3 = *relocationAddress;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pEVar4 = (file->sections).
           super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_140 = file;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pEVar19 = (file->sections).
                 super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>.
                 _M_impl.super__Vector_impl_data._M_start; pEVar19 != pEVar4; pEVar19 = pEVar19 + 1)
  {
    pEVar5 = pEVar19->section;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar19->index;
    if ((pEVar5->header).sh_type == 8) {
      uVar1 = (pEVar5->header).sh_addr;
      puVar16 = (ulong *)std::
                         map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                         ::operator[](&relocationOffsets,(key_type *)&errors);
      *puVar16 = (ulong)uVar1;
    }
    else {
      EVar2 = (pEVar5->header).sh_size;
      uVar1 = (pEVar5->header).sh_addralign;
      mVar21 = *relocationAddress;
      while (mVar21 % (long)(ulong)uVar1 != 0) {
        mVar21 = mVar21 + 1;
        *relocationAddress = mVar21;
      }
      peVar6 = (pEVar19->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar6 != (element_type *)0x0) {
        peVar6->value = mVar21;
        mVar21 = *relocationAddress;
      }
      pmVar17 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                ::operator[](&relocationOffsets,(key_type *)&errors);
      *pmVar17 = mVar21;
      *relocationAddress = *relocationAddress + (long)(int)EVar2;
    }
  }
  sVar7 = (this->outputData).size_;
  ByteArray::reserveBytes(&this->outputData,*relocationAddress - lVar3,'\0');
  pEVar19 = (local_140->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar4 = (local_140->sections).
           super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  args_1 = &local_140->name;
  bVar14 = 0;
  do {
    if (pEVar19 == pEVar4) {
      pEVar11 = (local_140->symbols).
                super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pEVar20 = (local_140->symbols).
                     super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>.
                     _M_impl.super__Vector_impl_data._M_start; pEVar20 != pEVar11;
          pEVar20 = pEVar20 + 1) {
        lVar3 = pEVar20->relocatedAddress;
        pbVar8 = (pointer)pEVar20->section;
        if (pbVar8 == (pointer)0xfff2) {
          lVar10 = *relocationAddress;
          lVar18 = lVar10;
          while (lVar18 % pEVar20->relativeAddress != 0) {
            lVar18 = lVar18 + 1;
            *relocationAddress = lVar18;
          }
          pEVar20->relocatedAddress = lVar18;
          lVar18 = *relocationAddress + pEVar20->size;
          *relocationAddress = lVar18;
          ByteArray::reserveBytes(&this->outputData,lVar18 - lVar10,'\0');
          iVar25 = pEVar20->relocatedAddress;
        }
        else if (pbVar8 == (pointer)0xfff1) {
          iVar25 = pEVar20->relativeAddress;
          pEVar20->relocatedAddress = iVar25;
        }
        else {
          lVar10 = pEVar20->relativeAddress;
          errors.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar8;
          pmVar17 = std::
                    map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    ::operator[](&relocationOffsets,(key_type *)&errors);
          iVar25 = lVar10 + *pmVar17;
          pEVar20->relocatedAddress = iVar25;
        }
        peVar6 = (pEVar20->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar6 != (element_type *)0x0) {
          peVar6->value = iVar25;
        }
        if (lVar3 != iVar25) {
          this->dataChanged = true;
        }
      }
      std::
      _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
      ::~_Rb_tree(&relocationOffsets._M_t);
      return (bool)(~bVar14 & 1);
    }
    if ((pEVar19->section->header).sh_type != 8) {
      pbVar8 = (pointer)pEVar19->index;
      this_01 = (ElfRelocator *)&sectionData;
      ByteArray::ByteArray((ByteArray *)this_01,&pEVar19->section->data);
      pEVar5 = pEVar19->relSection;
      if (pEVar5 != (ElfSection *)0x0) {
        uVar1 = (pEVar5->header).sh_type;
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar1;
        relocationActions.super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        relocationActions.super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        relocationActions.super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (offset = 0; offset < (pEVar5->header).sh_size;
            offset = offset + (uint)(uVar1 == 4) * 4 + 8) {
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar5->data;
          loadRelocation(this_01,&rela,uVar1 == 4,&pEVar5->data,offset,
                         (uint)((this_00->fileHeader).e_ident[5] != '\x02'));
          EVar2 = rela.r_info;
          pos = (size_t)(int)rela.r_offset;
          this_01 = (ElfRelocator *)
                    (this->relocator)._M_t.
                    super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>._M_t.
                    super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>.
                    super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
          uVar23 = rela.r_info & 0xff;
          iVar15 = (**(code **)((long)(this_01->outputData).data_ + 0x18))(this_01,(ulong)uVar23);
          if ((char)iVar15 == '\0') {
            symNum = EVar2 >> 8;
            if (EVar2 < 0x100) {
              bVar14 = 1;
              this_01 = (ElfRelocator *)0x0;
              Logger::queueError<int>((Logger *)0x0,0x17ebe6,(char *)&symNum,(int *)args);
            }
            else {
              ElfFile::getSymbol(this_00,&sym,(ulong)(uint)symNum);
              pbVar22 = (pointer)(ulong)sym.st_shndx;
              iVar15 = ByteArray::getDoubleWord
                                 (&sectionData,pos,
                                  (uint)((this_00->fileHeader).e_ident[5] != '\x02'));
              errors.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(errors.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar15
                                    );
              errors_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = pbVar8;
              pmVar17 = std::
                        map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                        ::operator[](&relocationOffsets,(key_type *)&errors_1);
              errors.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)(pos + *pmVar17);
              errors.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(rela.r_addend,
                                     errors.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
              pIVar9 = (this->relocator)._M_t.
                       super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>.
                       super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
              args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ulong)(sym.st_info & 0xf);
              (*pIVar9->_vptr_IElfRelocator[6])(pIVar9,&errors,(ulong)sym.st_value);
              if (sym.st_shndx == 0) {
                if ((ulong)sym.st_name == 0) {
                  bVar14 = 1;
                  this_01 = (ElfRelocator *)0x1;
                  Logger::queueError<>(Error,"Symbol without a name");
                  goto LAB_00164527;
                }
                __s = ElfFile::getStrTableString(this_00,(ulong)sym.st_name);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,__s,(allocator<char> *)&label);
                toLowercase((string *)&errors_1,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::string((string *)&local_70,(string *)&errors_1);
                Identifier::Identifier((Identifier *)&local_50,&local_70);
                args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0xffffffffffffffff;
                SymbolTable::getLabel
                          ((SymbolTable *)&label,(Identifier *)&Global.symbolTable,(int)&local_50,-1
                          );
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
                if (label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  Logger::queueError<std::__cxx11::string>
                            ((Logger *)0x1,0x17ec14,(char *)&errors_1,args);
LAB_0016457a:
                  bVar14 = 1;
                  bVar12 = false;
                }
                else {
                  if ((label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->defined
                      == false) {
                    args = args_1;
                    Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                              (Error,"Undefined external symbol %s in file %s",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &errors_1,args_1);
                    goto LAB_0016457a;
                  }
                  errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)(ulong)(uint)(label.
                                              super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_ptr)->value;
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ulong)(label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                ->data;
                  bVar12 = true;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                ;
                this_01 = (ElfRelocator *)&errors_1;
                std::__cxx11::string::~string((string *)this_01);
                if (!bVar12) goto LAB_00164527;
              }
              else {
                errors_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = pbVar22;
                pmVar17 = std::
                          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                          ::operator[](&relocationOffsets,(key_type *)&errors_1);
                errors.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_190 + *pmVar17);
              }
              errors_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              errors_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              errors_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pIVar9 = (this->relocator)._M_t.
                       super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>.
                       super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
              args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &relocationActions;
              iVar15 = (*pIVar9->_vptr_IElfRelocator[4])
                                 (pIVar9,(ulong)uVar23,&errors,args,&errors_1);
              pbVar22 = errors_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pbVar24 = errors_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((char)iVar15 == '\0') {
                for (; pbVar24 != pbVar22; pbVar24 = pbVar24 + 1) {
                  text._M_str = (char *)args;
                  text._M_len = (size_t)(pbVar24->_M_dataplus)._M_p;
                  Logger::queueError((Logger *)0x1,(ErrorType)pbVar24->_M_string_length,text);
                }
                bVar14 = 1;
              }
              this_01 = (ElfRelocator *)&errors_1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_01);
            }
          }
LAB_00164527:
        }
        errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pIVar9 = (this->relocator)._M_t.
                 super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>._M_t.
                 super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>.
                 super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
        iVar15 = (*pIVar9->_vptr_IElfRelocator[5])(pIVar9,&relocationActions,&errors);
        pbVar22 = errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar24 = errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pRVar26 = relocationActions.
                  super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pRVar13 = relocationActions.
                  super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((char)iVar15 == '\0') {
          for (; pbVar24 != pbVar22; pbVar24 = pbVar24 + 1) {
            text_00._M_str = (char *)args;
            text_00._M_len = (size_t)(pbVar24->_M_dataplus)._M_p;
            Logger::queueError((Logger *)0x1,(ErrorType)pbVar24->_M_string_length,text_00);
          }
          bVar14 = 1;
          pRVar26 = relocationActions.
                    super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pRVar13 = relocationActions.
                    super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        for (; pRVar26 != pRVar13; pRVar26 = pRVar26 + 1) {
          lVar10 = pRVar26->offset;
          errors_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar8;
          pmVar17 = std::
                    map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    ::operator[](&relocationOffsets,(key_type *)&errors_1);
          ByteArray::replaceDoubleWord
                    (&sectionData,lVar10 - *pmVar17,pRVar26->newValue,
                     (uint)((this_00->fileHeader).e_ident[5] != '\x02'));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&errors);
        std::_Vector_base<RelocationAction,_std::allocator<RelocationAction>_>::~_Vector_base
                  (&relocationActions.
                    super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>);
      }
      errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar8;
      pmVar17 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                ::operator[](&relocationOffsets,(key_type *)&errors);
      memcpy((this->outputData).data_ + *pmVar17 + (sVar7 - lVar3),sectionData.data_,
             sectionData.size_);
      ByteArray::~ByteArray(&sectionData);
    }
    pEVar19 = pEVar19 + 1;
  } while( true );
}

Assistant:

bool ElfRelocator::relocateFile(ElfRelocatorFile& file, int64_t& relocationAddress)
{
	ElfFile* elf = file.elf;
	int64_t start = relocationAddress;

	// calculate address for each section
	std::map<int64_t,int64_t> relocationOffsets;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;
		int size = section->getSize();

		if (section->getType() == SHT_NOBITS) 
		{
			// these sections should not be relocated...
			relocationOffsets[index] = section->getAddress();

		} else {
			while (relocationAddress % section->getAlignment())
				relocationAddress++;

			if (entry.label != nullptr)
				entry.label->setValue(relocationAddress);

			relocationOffsets[index] = relocationAddress;
			relocationAddress += size;
		}
	}

	size_t dataStart = outputData.size();
	outputData.reserveBytes((size_t)(relocationAddress-start));

	// load sections
	bool error = false;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;

		if (section->getType() == SHT_NOBITS)
		{
			// reserveBytes initialized the data to 0 already
			continue;
		}
		
		ByteArray sectionData = section->getData();

		// relocate if necessary
		ElfSection* relSection = entry.relSection;
		if (relSection != nullptr)
		{
			bool isRela = relSection->getType() == SHT_RELA;
			int structSize = isRela ? sizeof(Elf32_Rela) : sizeof(Elf32_Rel);

			std::vector<RelocationAction> relocationActions;
			for (unsigned int relOffset = 0; relOffset < relSection->getSize(); relOffset += structSize)
			{
				Elf32_Rela rela;
				loadRelocation(rela, isRela, relSection->getData(), relOffset, elf->getEndianness());
				int pos = rela.r_offset;

				if (relocator->isDummyRelocationType(rela.getType()))
					continue;

				int symNum = rela.getSymbolNum();
				if (symNum <= 0)
				{
					Logger::queueError(Logger::Warning, "Invalid symbol num %06X",symNum);
					error = true;
					continue;
				}

				Elf32_Sym sym;
				elf->getSymbol(sym, symNum);
				int symSection = sym.st_shndx;
				
				RelocationData relData;
				relData.opcode = sectionData.getDoubleWord(pos, elf->getEndianness());
				relData.opcodeOffset = pos+relocationOffsets[index];
				relData.addend = rela.r_addend;
				relocator->setSymbolAddress(relData,sym.st_value,sym.st_info & 0xF);

				// externs?
				if (sym.st_shndx == 0)
				{
					if (sym.st_name == 0)
					{
						Logger::queueError(Logger::Error, "Symbol without a name");
						error = true;
						continue;
					}

					std::string symName = toLowercase(elf->getStrTableString(sym.st_name));

					std::shared_ptr<Label> label = Global.symbolTable.getLabel(Identifier(symName),-1,-1);
					if (label == nullptr)
					{
						Logger::queueError(Logger::Error, "Invalid external symbol %s",symName);
						error = true;
						continue;
					}
					if (!label->isDefined())
					{
						Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",symName,file.name);
						error = true;
						continue;
					}
					
					relData.relocationBase = (unsigned int) label->getValue();
					relData.targetSymbolType = label->isData() ? STT_OBJECT : STT_FUNC;
					relData.targetSymbolInfo = label->getInfo();
				} else {
					relData.relocationBase = relocationOffsets[symSection]+relData.symbolAddress;
				}

				std::vector<std::string> errors;
				if (!relocator->relocateOpcode(rela.getType(), relData, relocationActions, errors))
				{
					for (const std::string& error : errors)
					{
						Logger::queueError(Logger::Error, error);
					}
					error = true;
					continue;
				}
			}

			// finish any dangling relocations
			std::vector<std::string> errors;
			if (!relocator->finish(relocationActions, errors))
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}

			// now actually write the relocated values
			for (const RelocationAction& action : relocationActions)
			{
				sectionData.replaceDoubleWord(action.offset-relocationOffsets[index], action.newValue, elf->getEndianness());
			}
		}

		size_t arrayStart = (size_t) (dataStart+relocationOffsets[index]-start);
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}
	
	// now update symbols
	for (ElfRelocatorSymbol& sym: file.symbols)
	{
		int64_t oldAddress = sym.relocatedAddress;

		switch (sym.section)
		{
		case SHN_ABS:		// address does not change
			sym.relocatedAddress = sym.relativeAddress;
			break;
		case SHN_COMMON:	// needs to be allocated. relativeAddress gives alignment constraint
			{
				int64_t start = relocationAddress;

				while (relocationAddress % sym.relativeAddress)
					relocationAddress++;

				sym.relocatedAddress = relocationAddress;
				relocationAddress += sym.size;
				outputData.reserveBytes((size_t)(relocationAddress-start));
			}
			break;
		default:			// normal relocated symbol
			sym.relocatedAddress = sym.relativeAddress+relocationOffsets[sym.section];
			break;
		}

		if (sym.label != nullptr)
			sym.label->setValue(sym.relocatedAddress);

		if (oldAddress != sym.relocatedAddress)
			dataChanged = true;
	}

	return !error;
}